

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::PerfEvents_Tracepoint::~PerfEvents_Tracepoint(PerfEvents_Tracepoint *this)

{
  ~PerfEvents_Tracepoint(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

PerfEvents_Tracepoint::~PerfEvents_Tracepoint() = default;